

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_smote(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  CHAR_DATA *ch_00;
  bool bVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  CHAR_DATA **ppCVar7;
  char temp [4608];
  char last [4608];
  
  bVar2 = is_npc(ch);
  if ((bVar2) || ((ch->comm[0] & 0x80000) == 0)) {
    if (*argument == '\0') {
      pcVar3 = "Emote what?\n\r";
    }
    else {
      pcVar3 = strstr(argument,ch->name);
      if ((pcVar3 != (char *)0x0) || (bVar2 = is_npc(ch), bVar2)) {
        send_to_char(argument,ch);
        send_to_char("\n\r",ch);
        ppCVar7 = &ch->in_room->people;
        sVar6 = 0;
LAB_002c483c:
        ch_00 = *ppCVar7;
        if (ch_00 == (CHAR_DATA *)0x0) {
          return;
        }
        if ((ch_00 != ch) && (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) {
          __s = strstr(argument,ch_00->name);
          pcVar3 = argument;
          if (__s != (char *)0x0) {
            strcpy(temp,argument);
            sVar4 = strlen(argument);
            sVar5 = strlen(__s);
            temp[sVar4 - sVar5] = '\0';
            last[0] = '\0';
            pcVar3 = ch_00->name;
            do {
              cVar1 = *__s;
              if (cVar1 == '\'') {
                sVar4 = strlen(ch_00->name);
                if (sVar4 != sVar6) goto LAB_002c4912;
                sVar4 = strlen(temp);
                (temp + sVar4)[0] = 'r';
                (temp + sVar4)[1] = '\0';
              }
              else {
                if (cVar1 == 's') {
                  sVar4 = strlen(ch_00->name);
                  if (sVar4 != sVar6) goto LAB_002c4912;
                }
                else {
                  if (cVar1 == '\0') goto LAB_002c49ad;
LAB_002c4912:
                  if (cVar1 == *pcVar3) {
                    sVar4 = strlen(ch_00->name);
                    bVar2 = sVar4 == sVar6;
                    sVar6 = (size_t)((int)sVar6 + 1);
                    if (bVar2) {
                      sVar6 = 1;
                    }
                    if (sVar4 == sVar6) {
                      sVar4 = strlen(temp);
                      builtin_strncpy(temp + sVar4,"you",4);
                      last[0] = '\0';
                      pcVar3 = ch_00->name;
                    }
                    else {
                      pcVar3 = pcVar3 + 1;
                      strncat(last,__s,1);
                    }
                    goto LAB_002c49a5;
                  }
                  strcat(temp,last);
                  strncat(temp,__s,1);
                  last[0] = '\0';
                  pcVar3 = ch_00->name;
                }
                sVar6 = 0;
              }
LAB_002c49a5:
              __s = __s + 1;
            } while( true );
          }
          goto LAB_002c49c0;
        }
        goto LAB_002c49d7;
      }
      pcVar3 = "You must include your name in an smote.\n\r";
    }
  }
  else {
    pcVar3 = "You can\'t show your emotions.\n\r";
  }
  send_to_char(pcVar3,ch);
  return;
LAB_002c49ad:
  pcVar3 = temp;
LAB_002c49c0:
  send_to_char(pcVar3,ch_00);
  send_to_char("\n\r",ch_00);
LAB_002c49d7:
  ppCVar7 = &ch_00->next_in_room;
  goto LAB_002c483c;
}

Assistant:

void do_smote(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	char *letter, *name;
	char last[MAX_INPUT_LENGTH], temp[MAX_STRING_LENGTH];
	unsigned int matches = 0;

	if (!is_npc(ch) && IS_SET(ch->comm, COMM_NOEMOTE))
	{
		send_to_char("You can't show your emotions.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Emote what?\n\r", ch);
		return;
	}

	if (strstr(argument, ch->name) == nullptr && !is_npc(ch))
	{
		send_to_char("You must include your name in an smote.\n\r", ch);
		return;
	}

	send_to_char(argument, ch);
	send_to_char("\n\r", ch);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (vch->desc == nullptr || vch == ch)
			continue;

		letter = strstr(argument, vch->name);

		if (letter == nullptr)
		{
			send_to_char(argument, vch);
			send_to_char("\n\r", vch);
			continue;
		}

		strcpy(temp, argument);
		temp[strlen(argument) - strlen(letter)] = '\0';
		last[0] = '\0';
		name = vch->name;

		for (; *letter != '\0'; letter++)
		{
			if (*letter == '\'' && matches == strlen(vch->name))
			{
				strcat(temp, "r");
				continue;
			}

			if (*letter == 's' && matches == strlen(vch->name))
			{
				matches = 0;
				continue;
			}

			if (matches == strlen(vch->name))
			{
				matches = 0;
			}

			if (*letter == *name)
			{
				matches++;
				name++;

				if (matches == strlen(vch->name))
				{
					strcat(temp, "you");
					last[0] = '\0';
					name = vch->name;
					continue;
				}

				strncat(last, letter, 1);
				continue;
			}

			matches = 0;
			strcat(temp, last);
			strncat(temp, letter, 1);
			last[0] = '\0';
			name = vch->name;
		}

		send_to_char(temp, vch);
		send_to_char("\n\r", vch);
	}
}